

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

String * __thiscall
doctest::detail::
stringifyBinaryExpr<boost::iterator_range<boost::iterators::indirect_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<signed_char,std::default_delete<signed_char>>*,std::vector<std::unique_ptr<signed_char,std::default_delete<signed_char>>,std::allocator<std::unique_ptr<signed_char,std::default_delete<signed_char>>>>>,boost::use_default,boost::use_default,boost::use_default,boost::use_default>>,std::initializer_list<int>>
          (String *__return_storage_ptr__,detail *this,
          iterator_range<boost::iterators::indirect_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<signed_char,_std::default_delete<signed_char>_>_*,_std::vector<std::unique_ptr<signed_char,_std::default_delete<signed_char>_>,_std::allocator<std::unique_ptr<signed_char,_std::default_delete<signed_char>_>_>_>_>,_boost::use_default,_boost::use_default,_boost::use_default,_boost::use_default>_>
          *lhs,char *op,initializer_list<int> *rhs)

{
  ostream *stream;
  String SStack_78;
  String local_60;
  String local_48;
  String local_30;
  
  stream = tlssPush();
  filldata<boost::iterator_range<boost::iterators::indirect_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<signed_char,_std::default_delete<signed_char>_>_*,_std::vector<std::unique_ptr<signed_char,_std::default_delete<signed_char>_>,_std::allocator<std::unique_ptr<signed_char,_std::default_delete<signed_char>_>_>_>_>,_boost::use_default,_boost::use_default,_boost::use_default,_boost::use_default>_>_>
  ::fill(stream,(iterator_range<boost::iterators::indirect_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<signed_char,_std::default_delete<signed_char>_>_*,_std::vector<std::unique_ptr<signed_char,_std::default_delete<signed_char>_>,_std::allocator<std::unique_ptr<signed_char,_std::default_delete<signed_char>_>_>_>_>,_boost::use_default,_boost::use_default,_boost::use_default,_boost::use_default>_>
                 *)this);
  tlssPop();
  String::String(&local_60,(char *)lhs);
  operator+(&local_30,&local_48,&local_60);
  String::String(&SStack_78,"{?}");
  operator+(__return_storage_ptr__,&local_30,&SStack_78);
  String::~String(&SStack_78);
  String::~String(&local_30);
  String::~String(&local_60);
  String::~String(&local_48);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }